

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseRenderingCase::drawPrimitives
          (BaseRenderingCase *this,Surface *result,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertexData,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *colorData,
          GLenum primitiveType)

{
  code *pcVar1;
  RenderContext *pRVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  void *pvVar9;
  TextureFormat local_68;
  Surface *local_60;
  PixelBufferAccess local_58;
  long lVar8;
  
  local_60 = result;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  uVar4 = (**(code **)(lVar8 + 0x780))((this->m_shader->m_program).m_program,"a_position");
  uVar5 = (**(code **)(lVar8 + 0x780))((this->m_shader->m_program).m_program,"a_color");
  uVar6 = (**(code **)(lVar8 + 0xb48))((this->m_shader->m_program).m_program,"u_pointSize");
  (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar8 + 0x188))(0x4000);
  (**(code **)(lVar8 + 0x1a00))(0,0,this->m_renderSize);
  (**(code **)(lVar8 + 0x1680))((this->m_shader->m_program).m_program);
  (**(code **)(lVar8 + 0x610))(uVar4);
  (**(code **)(lVar8 + 0x19f0))
            (uVar4,4,0x1406,0,0,
             (vertexData->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start);
  (**(code **)(lVar8 + 0x610))(uVar5);
  (**(code **)(lVar8 + 0x19f0))
            (uVar5,4,0x1406,0,0,
             (colorData->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start);
  pcVar1 = *(code **)(lVar8 + 0x14e0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  (*pcVar1)(uVar6);
  pcVar1 = *(code **)(lVar8 + 0xce0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  (*pcVar1)();
  (**(code **)(lVar8 + 0x538))
            (primitiveType,0,
             (ulong)((long)(vertexData->
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(vertexData->
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 4);
  (**(code **)(lVar8 + 0x518))(uVar5);
  (**(code **)(lVar8 + 0x518))(uVar4);
  (**(code **)(lVar8 + 0x1680))(0);
  (**(code **)(lVar8 + 0x648))();
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"draw primitives",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizationTests.cpp"
                  ,0x17d);
  if (this->m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE) {
    (**(code **)(lVar8 + 0x78))(0x8ca8,this->m_fbo);
    (**(code **)(lVar8 + 0x78))(0x8ca9,this->m_blitDstFbo);
    iVar3 = this->m_renderSize;
    (**(code **)(lVar8 + 0x140))(0,0,iVar3,iVar3,0,0,iVar3,iVar3,0x4000,0x2600);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"blit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizationTests.cpp"
                    ,0x187);
    (**(code **)(lVar8 + 0x78))(0x8ca8,this->m_blitDstFbo);
    pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_68.order = RGBA;
    local_68.type = UNORM_INT8;
    pvVar9 = (void *)(local_60->m_pixels).m_cap;
    if (pvVar9 != (void *)0x0) {
      pvVar9 = (local_60->m_pixels).m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_58,&local_68,local_60->m_width,local_60->m_height,1,pvVar9);
    glu::readPixels(pRVar2,0,0,&local_58);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizationTests.cpp"
                    ,0x18d);
    (**(code **)(lVar8 + 0x78))(0x8d40,this->m_fbo);
  }
  else {
    pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_68.order = RGBA;
    local_68.type = UNORM_INT8;
    pvVar9 = (void *)(local_60->m_pixels).m_cap;
    if (pvVar9 != (void *)0x0) {
      pvVar9 = (local_60->m_pixels).m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_58,&local_68,local_60->m_width,local_60->m_height,1,pvVar9);
    glu::readPixels(pRVar2,0,0,&local_58);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizationTests.cpp"
                    ,0x194);
  }
  return;
}

Assistant:

void BaseRenderingCase::drawPrimitives (tcu::Surface& result, const std::vector<tcu::Vec4>& vertexData, const std::vector<tcu::Vec4>& colorData, glw::GLenum primitiveType)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const glw::GLint		positionLoc		= gl.getAttribLocation(m_shader->getProgram(), "a_position");
	const glw::GLint		colorLoc		= gl.getAttribLocation(m_shader->getProgram(), "a_color");
	const glw::GLint		pointSizeLoc	= gl.getUniformLocation(m_shader->getProgram(), "u_pointSize");

	gl.clearColor					(0, 0, 0, 1);
	gl.clear						(GL_COLOR_BUFFER_BIT);
	gl.viewport						(0, 0, m_renderSize, m_renderSize);
	gl.useProgram					(m_shader->getProgram());
	gl.enableVertexAttribArray		(positionLoc);
	gl.vertexAttribPointer			(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &vertexData[0]);
	gl.enableVertexAttribArray		(colorLoc);
	gl.vertexAttribPointer			(colorLoc, 4, GL_FLOAT, GL_FALSE, 0, &colorData[0]);
	gl.uniform1f					(pointSizeLoc, getPointSize());
	gl.lineWidth					(getLineWidth());
	gl.drawArrays					(primitiveType, 0, (glw::GLsizei)vertexData.size());
	gl.disableVertexAttribArray		(colorLoc);
	gl.disableVertexAttribArray		(positionLoc);
	gl.useProgram					(0);
	gl.finish						();
	GLU_EXPECT_NO_ERROR				(gl.getError(), "draw primitives");

	// read pixels
	if (m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE)
	{
		// resolve msaa
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo);
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_blitDstFbo);

		gl.blitFramebuffer(0, 0, m_renderSize, m_renderSize, 0, 0, m_renderSize, m_renderSize, GL_COLOR_BUFFER_BIT, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "blit");

		// read resolved
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_blitDstFbo);

		glu::readPixels(m_context.getRenderContext(), 0, 0, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	}
	else
	{
		glu::readPixels(m_context.getRenderContext(), 0, 0, result.getAccess());
		GLU_EXPECT_NO_ERROR				(gl.getError(), "read pixels");
	}
}